

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O0

nes_system * nes_system_create(nes_config *config)

{
  nes_system *system;
  nes_cartridge *cartridge;
  nes_config *config_local;
  
  system = (nes_system *)0x0;
  if (config->source_type == NES_SOURCE_FILE) {
    system = (nes_system *)nes_rom_load_cartridge((config->source).file_path);
  }
  else if (config->source_type == NES_SOURCE_MEMORY) {
    system = (nes_system *)
             nes_rom_create_cartridge
                       ((config->source).memory.data,(config->source).memory.data_size);
  }
  else if (config->source_type == NES_SOURCE_CARTRIGE) {
    system = (nes_system *)(config->source).cartridge;
  }
  if (system == (nes_system *)0x0) {
    config_local = (nes_config *)0x0;
  }
  else {
    config_local = (nes_config *)malloc(0x1c710);
    ((nes_system *)config_local)->cartridge = (nes_cartridge *)system;
    memcpy(&((nes_system *)config_local)->config,config,0x58);
    nes_system_reset((nes_system *)config_local);
  }
  return (nes_system *)config_local;
}

Assistant:

nes_system* nes_system_create(nes_config* config)
{
    nes_cartridge* cartridge = 0;

    if (config->source_type == NES_SOURCE_FILE)
    {
        cartridge = nes_rom_load_cartridge(config->source.file_path);
    }
    else if (config->source_type == NES_SOURCE_MEMORY)
    {
        cartridge = nes_rom_create_cartridge(config->source.memory.data, config->source.memory.data_size);
    }
    else if (config->source_type == NES_SOURCE_CARTRIGE)
    {
        cartridge = config->source.cartridge;
    }

    if (!cartridge)
        return 0;

    nes_system* system  = (nes_system*)malloc(sizeof(nes_system));
    system->cartridge   = cartridge;
    system->config      = *config;

    nes_system_reset(system);

    return system;
}